

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubDLevel::CopyEvaluationCacheForExperts
          (ON_SubDLevel *this,ON_SubDHeap *this_heap,ON_SubDLevel *src,ON_SubDHeap *src_heap,
          uint *copy_status)

{
  ON_SubDFace **ppOVar1;
  ON_SubDFace **ppOVar2;
  uint level_index;
  uint level_index_00;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint destination_subd_display_density;
  uint uVar9;
  ON_SubDVertex *pOVar10;
  ON_SubDVertex *pOVar11;
  ON_SubDEdge *pOVar12;
  ON_SubDEdge *pOVar13;
  ON_SubDFacePtr *pOVar14;
  ON_SubDFace *pOVar15;
  ON_SubDFace *pOVar16;
  ON_SubDMeshFragment *pOVar17;
  ON_SubDEdgePtr *pOVar18;
  ON_SubDSectorSurfacePoint *pOVar19;
  ulong uVar20;
  long lVar21;
  unsigned_short uVar22;
  int iVar23;
  ON_SubDFacePtr *pOVar24;
  ON_SubDEdgePtr *pOVar25;
  ON_SubDSectorSurfacePoint *pOVar26;
  ON_SimpleArray<ON_3dPoint> *pOVar27;
  undefined8 *puVar28;
  ulong uVar29;
  undefined8 *puVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  byte bVar34;
  ON_SubDSectorSurfacePoint in_stack_fffffffffffffd58;
  ON_3dPoint local_208;
  ON_SubDFaceIdIterator this_fit;
  ON_SubDEdgeIdIterator this_eit;
  ON_SubDFaceIdIterator src_fit;
  ON_SubDEdgeIdIterator src_eit;
  ON_SubDVertexIdIterator src_vit;
  ON_SubDVertexIdIterator this_vit;
  ON_SimpleArray<ON_3dPoint> edge_curve_cvs;
  undefined8 local_a0 [12];
  undefined8 local_40;
  ON_SubDFace *local_38;
  
  bVar34 = 0;
  *copy_status = 0;
  if ((((this == src) || (this->m_vertex_count != src->m_vertex_count)) ||
      (this->m_edge_count != src->m_edge_count)) || (this->m_face_count != src->m_face_count)) {
    ON_SubDIncrementErrorCount();
    return false;
  }
  destination_subd_display_density =
       ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(4,this->m_face_count);
  level_index = this->m_level_index;
  level_index_00 = src->m_level_index;
  ON_SubDVertexIdIterator::ON_SubDVertexIdIterator(&this_vit);
  ON_SubDVertexIdIterator::ON_SubDVertexIdIterator(&src_vit);
  ON_SubDHeap::InitializeVertexIdIterator(this_heap,&this_vit);
  ON_SubDHeap::InitializeVertexIdIterator(src_heap,&src_vit);
  pOVar10 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&this_vit,level_index);
  pOVar11 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&src_vit,level_index_00);
  bVar8 = false;
  while ((pOVar10 != (ON_SubDVertex *)0x0 && (pOVar11 != (ON_SubDVertex *)0x0))) {
    if ((((pOVar10->super_ON_SubDComponentBase).m_id != (pOVar11->super_ON_SubDComponentBase).m_id)
        || ((pOVar10->m_edge_count != pOVar11->m_edge_count ||
            (pOVar10->m_face_count != pOVar11->m_face_count)))) ||
       (pOVar10->m_vertex_tag != pOVar11->m_vertex_tag)) goto LAB_005e6ea9;
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&edge_curve_cvs,pOVar10->m_P);
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&this_eit,pOVar11->m_P);
    bVar5 = ON_3dPoint::operator==((ON_3dPoint *)&edge_curve_cvs,(ON_3dPoint *)&this_eit);
    if (!bVar5) goto LAB_005e6ea9;
    bVar5 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar10->super_ON_SubDComponentBase);
    if (bVar5) {
      ON_SubDVertex::SubdivisionPoint((ON_3dPoint *)&edge_curve_cvs,pOVar10);
      ON_SubDVertex::SubdivisionPoint((ON_3dPoint *)&this_eit,pOVar11);
      bVar5 = ON_3dPoint::operator==((ON_3dPoint *)&edge_curve_cvs,(ON_3dPoint *)&this_eit);
      if (!bVar5) goto LAB_005e6ea9;
    }
    bVar5 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar10->super_ON_SubDComponentBase);
    if (((!bVar5) || (bVar5 = ON_SubDVertex::SurfacePointIsSet(pOVar10), !bVar5)) &&
       (bVar5 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                          (&pOVar11->super_ON_SubDComponentBase), bVar5)) {
      uVar20 = 0;
      while (pOVar10->m_edge_count != uVar20) {
        uVar33 = pOVar10->m_edges[uVar20].m_ptr;
        iVar23 = 0;
        iVar32 = 0;
        uVar29 = uVar33 & 0xfffffffffffffff8;
        if (uVar29 != 0) {
          iVar32 = *(int *)(uVar29 + 8);
        }
        uVar29 = pOVar11->m_edges[uVar20].m_ptr;
        uVar31 = uVar29 & 0xfffffffffffffff8;
        if (uVar31 != 0) {
          iVar23 = *(int *)(uVar31 + 8);
        }
        if ((iVar32 != iVar23) || (uVar20 = uVar20 + 1, (((uint)uVar29 ^ (uint)uVar33) & 1) != 0)) {
          ON_SubDIncrementErrorCount();
          goto LAB_005e6eae;
        }
      }
      uVar20 = 0;
      while (pOVar10->m_face_count != uVar20) {
        ppOVar1 = pOVar10->m_faces + uVar20;
        if (((*ppOVar1 == (ON_SubDFace *)0x0) ||
            (ppOVar2 = pOVar11->m_faces + uVar20, *ppOVar2 == (ON_SubDFace *)0x0)) ||
           (uVar20 = uVar20 + 1,
           ((*ppOVar1)->super_ON_SubDComponentBase).m_id !=
           ((*ppOVar2)->super_ON_SubDComponentBase).m_id)) {
          ON_SubDIncrementErrorCount();
          goto LAB_005e6eae;
        }
      }
      bVar8 = true;
    }
    pOVar10 = ON_SubDVertexIdIterator::NextVertexOnLevel(&this_vit,level_index);
    pOVar11 = ON_SubDVertexIdIterator::NextVertexOnLevel(&src_vit,level_index_00);
  }
  if (pOVar10 != (ON_SubDVertex *)0x0 || pOVar11 != (ON_SubDVertex *)0x0) {
LAB_005e6ea9:
    ON_SubDIncrementErrorCount();
LAB_005e6eae:
    bVar8 = false;
    goto LAB_005e6eb0;
  }
  ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator(&this_eit);
  ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator(&src_eit);
  ON_SubDHeap::InitializeEdgeIdIterator(this_heap,&this_eit);
  ON_SubDHeap::InitializeEdgeIdIterator(src_heap,&src_eit);
  pOVar12 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&this_eit,level_index);
  pOVar13 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&src_eit,level_index_00);
  bVar5 = false;
  while ((pOVar12 != (ON_SubDEdge *)0x0 && (pOVar13 != (ON_SubDEdge *)0x0))) {
    if (((pOVar12->super_ON_SubDComponentBase).m_id != (pOVar13->super_ON_SubDComponentBase).m_id)
       || ((pOVar12->m_face_count != pOVar13->m_face_count ||
           (lVar21 = 0x10, pOVar12->m_edge_tag != pOVar13->m_edge_tag)))) goto LAB_005e70f9;
    while (lVar21 != 0x12) {
      dVar3 = (pOVar12->super_ON_SubDComponentBase).m_saved_subd_point1[lVar21 + -3];
      if (((dVar3 == 0.0) ||
          (dVar4 = (pOVar13->super_ON_SubDComponentBase).m_saved_subd_point1[lVar21 + -3],
          dVar4 == 0.0)) ||
         (lVar21 = lVar21 + 1, *(int *)((long)dVar3 + 8) != *(int *)((long)dVar4 + 8))) {
        ON_SubDIncrementErrorCount();
        goto LAB_005e70cc;
      }
    }
    bVar6 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar12->super_ON_SubDComponentBase);
    if (bVar6) {
      ON_SubDEdge::SubdivisionPoint((ON_3dPoint *)&edge_curve_cvs,pOVar12);
      ON_SubDEdge::SubdivisionPoint((ON_3dPoint *)&this_fit,pOVar13);
      bVar6 = ON_3dPoint::operator==((ON_3dPoint *)&edge_curve_cvs,(ON_3dPoint *)&this_fit);
      if (!bVar6) goto LAB_005e70f9;
    }
    bVar6 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar13->super_ON_SubDComponentBase);
    if (bVar6) {
      pOVar14 = pOVar12->m_face2;
      pOVar24 = pOVar13->m_face2;
      for (uVar22 = 0; pOVar12->m_face_count != uVar22; uVar22 = uVar22 + 1) {
        if ((uVar22 == 2) &&
           ((pOVar14 = pOVar12->m_facex, pOVar14 == (ON_SubDFacePtr *)0x0 ||
            (pOVar24 = pOVar13->m_facex, pOVar24 == (ON_SubDFacePtr *)0x0)))) {
LAB_005e70ed:
          ON_SubDIncrementErrorCount();
          goto LAB_005e70cc;
        }
        uVar20 = pOVar14->m_ptr & 0xfffffffffffffff8;
        if (uVar20 == 0) goto LAB_005e70ed;
        uVar33 = pOVar24->m_ptr & 0xfffffffffffffff8;
        if (((uVar33 == 0) || (*(int *)(uVar20 + 8) != *(int *)(uVar33 + 8))) ||
           ((*(short *)(uVar20 + 0x9c) != *(short *)(uVar33 + 0x9c) ||
            ((((uint)pOVar24->m_ptr ^ (uint)pOVar14->m_ptr) & 1) != 0)))) goto LAB_005e70ed;
        pOVar14 = pOVar14 + 1;
        pOVar24 = pOVar24 + 1;
      }
      bVar5 = true;
    }
    pOVar12 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&this_eit,level_index);
    pOVar13 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&src_eit,level_index_00);
  }
  if (pOVar12 == (ON_SubDEdge *)0x0 && pOVar13 == (ON_SubDEdge *)0x0) {
    ON_SubDFaceIdIterator::ON_SubDFaceIdIterator(&this_fit);
    ON_SubDFaceIdIterator::ON_SubDFaceIdIterator(&src_fit);
    ON_SubDHeap::InitializeFaceIdIterator(this_heap,&this_fit);
    ON_SubDHeap::InitializeFaceIdIterator(src_heap,&src_fit);
    pOVar15 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&this_fit,level_index);
    pOVar16 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&src_fit,level_index_00);
    bVar6 = false;
    while ((pOVar15 != (ON_SubDFace *)0x0 && (pOVar16 != (ON_SubDFace *)0x0))) {
      if (((pOVar15->super_ON_SubDComponentBase).m_id != (pOVar16->super_ON_SubDComponentBase).m_id)
         || (pOVar15->m_edge_count != pOVar16->m_edge_count)) goto LAB_005e72e0;
      bVar7 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar15->super_ON_SubDComponentBase)
      ;
      if (bVar7) {
        ON_SubDFace::SubdivisionPoint((ON_3dPoint *)&edge_curve_cvs,pOVar15);
        ON_SubDFace::SubdivisionPoint(&local_208,pOVar16);
        bVar7 = ON_3dPoint::operator==((ON_3dPoint *)&edge_curve_cvs,&local_208);
        if (!bVar7) goto LAB_005e72e0;
      }
      bVar7 = ON_SubDComponentBase::SavedSubdivisionPointIsSet(&pOVar15->super_ON_SubDComponentBase)
      ;
      if (((!bVar7) ||
          (pOVar17 = ON_SubDFace::MeshFragments(pOVar15), pOVar17 == (ON_SubDMeshFragment *)0x0)) &&
         (bVar7 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                            (&pOVar16->super_ON_SubDComponentBase), bVar7)) {
        pOVar18 = pOVar15->m_edge4;
        pOVar25 = pOVar16->m_edge4;
        for (uVar22 = 0; pOVar15->m_edge_count != uVar22; uVar22 = uVar22 + 1) {
          if ((uVar22 == 4) &&
             ((pOVar18 = pOVar15->m_edgex, pOVar18 == (ON_SubDEdgePtr *)0x0 ||
              (pOVar25 = pOVar16->m_edgex, pOVar25 == (ON_SubDEdgePtr *)0x0)))) {
LAB_005e72d4:
            ON_SubDIncrementErrorCount();
            goto LAB_005e72e5;
          }
          iVar23 = 0;
          iVar32 = 0;
          uVar20 = pOVar18->m_ptr & 0xfffffffffffffff8;
          if (uVar20 != 0) {
            iVar32 = *(int *)(uVar20 + 8);
          }
          uVar20 = pOVar25->m_ptr & 0xfffffffffffffff8;
          if (uVar20 != 0) {
            iVar23 = *(int *)(uVar20 + 8);
          }
          if ((iVar32 != iVar23) || ((((uint)pOVar25->m_ptr ^ (uint)pOVar18->m_ptr) & 1) != 0))
          goto LAB_005e72d4;
          pOVar18 = pOVar18 + 1;
          pOVar25 = pOVar25 + 1;
        }
        bVar6 = true;
      }
      pOVar15 = ON_SubDFaceIdIterator::NextFaceOnLevel(&this_fit,level_index);
      pOVar16 = ON_SubDFaceIdIterator::NextFaceOnLevel(&src_fit,level_index_00);
    }
    if (pOVar15 == (ON_SubDFace *)0x0 && pOVar16 == (ON_SubDFace *)0x0) {
      if ((!bVar8 && !bVar5) && !bVar6) goto LAB_005e72e5;
      if (bVar8) {
        pOVar10 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&this_vit,level_index);
        pOVar11 = ON_SubDVertexIdIterator::FirstVertexOnLevel(&src_vit,level_index_00);
        while ((pOVar10 != (ON_SubDVertex *)0x0 && (pOVar11 != (ON_SubDVertex *)0x0))) {
          if (((pOVar11->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) {
            local_208.x = (pOVar11->super_ON_SubDComponentBase).m_saved_subd_point1[0];
            local_208.y = (pOVar11->super_ON_SubDComponentBase).m_saved_subd_point1[1];
            local_208.z = (pOVar11->super_ON_SubDComponentBase).m_saved_subd_point1[2];
            bVar8 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                              (&pOVar10->super_ON_SubDComponentBase);
            if (!bVar8) {
              ON_SubDComponentBase::SetSavedSubdivisionPoint
                        (&pOVar10->super_ON_SubDComponentBase,&local_208.x);
            }
            bVar8 = ON_SubDVertex::SurfacePointIsSet(pOVar10);
            if (!bVar8) {
              for (pOVar19 = ON_SubDVertex::SectorSurfacePointForExperts(pOVar11);
                  pOVar19 != (ON_SubDSectorSurfacePoint *)0x0;
                  pOVar19 = pOVar19->m_next_sector_limit_point) {
                pOVar26 = pOVar19;
                pOVar27 = &edge_curve_cvs;
                for (lVar21 = 0xc; lVar21 != 0; lVar21 = lVar21 + -1) {
                  pOVar27->_vptr_ON_SimpleArray = (_func_int **)pOVar26->m_limitP[0];
                  pOVar26 = (ON_SubDSectorSurfacePoint *)((long)pOVar26 + (ulong)bVar34 * -0x10 + 8)
                  ;
                  pOVar27 = (ON_SimpleArray<ON_3dPoint> *)
                            ((long)pOVar27 + (ulong)bVar34 * -0x10 + 8);
                }
                if (pOVar19->m_sector_face == (ON_SubDFace *)0x0) {
                  pOVar15 = (ON_SubDFace *)0x0;
                }
                else {
                  uVar9 = ON_SubDVertex::FaceArrayIndex(pOVar11,pOVar19->m_sector_face);
                  if (pOVar11->m_face_count <= uVar9) break;
                  pOVar15 = pOVar10->m_faces[uVar9];
                }
                pOVar27 = &edge_curve_cvs;
                puVar28 = local_a0;
                for (lVar21 = 0xc; lVar21 != 0; lVar21 = lVar21 + -1) {
                  *puVar28 = pOVar27->_vptr_ON_SimpleArray;
                  pOVar27 = (ON_SimpleArray<ON_3dPoint> *)
                            ((long)pOVar27 + (ulong)bVar34 * -0x10 + 8);
                  puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
                }
                local_40 = 1;
                local_38 = pOVar15;
                puVar28 = local_a0;
                puVar30 = (undefined8 *)&stack0xfffffffffffffd58;
                for (lVar21 = 0xe; lVar21 != 0; lVar21 = lVar21 + -1) {
                  *puVar30 = *puVar28;
                  puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
                  puVar30 = puVar30 + (ulong)bVar34 * -2 + 1;
                }
                ON_SubDVertex::SetSavedSurfacePoint(pOVar10,true,in_stack_fffffffffffffd58);
              }
            }
          }
          pOVar10 = ON_SubDVertexIdIterator::NextVertexOnLevel(&this_vit,level_index);
          pOVar11 = ON_SubDVertexIdIterator::NextVertexOnLevel(&src_vit,level_index_00);
        }
      }
      if (bVar5) {
        ON_SimpleArray<ON_3dPoint>::ON_SimpleArray(&edge_curve_cvs,0x13);
        pOVar12 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&this_eit,level_index);
        pOVar13 = ON_SubDEdgeIdIterator::FirstEdgeOnLevel(&src_eit,level_index_00);
        while ((pOVar12 != (ON_SubDEdge *)0x0 && (pOVar13 != (ON_SubDEdge *)0x0))) {
          if (((pOVar13->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) {
            local_208.x = (pOVar13->super_ON_SubDComponentBase).m_saved_subd_point1[0];
            local_208.y = (pOVar13->super_ON_SubDComponentBase).m_saved_subd_point1[1];
            local_208.z = (pOVar13->super_ON_SubDComponentBase).m_saved_subd_point1[2];
            bVar8 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                              (&pOVar12->super_ON_SubDComponentBase);
            if (!bVar8) {
              ON_SubDComponentBase::SetSavedSubdivisionPoint
                        (&pOVar12->super_ON_SubDComponentBase,&local_208.x);
            }
          }
          pOVar12 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&this_eit,level_index);
          pOVar13 = ON_SubDEdgeIdIterator::NextEdgeOnLevel(&src_eit,level_index_00);
        }
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&edge_curve_cvs);
      }
      if (bVar6) {
        pOVar15 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&this_fit,level_index);
        pOVar16 = ON_SubDFaceIdIterator::FirstFaceOnLevel(&src_fit,level_index_00);
        while ((pOVar15 != (ON_SubDFace *)0x0 && (pOVar16 != (ON_SubDFace *)0x0))) {
          if (((pOVar16->super_ON_SubDComponentBase).m_saved_points_flags & 0x40) != 0) {
            local_208.x = (pOVar16->super_ON_SubDComponentBase).m_saved_subd_point1[0];
            local_208.y = (pOVar16->super_ON_SubDComponentBase).m_saved_subd_point1[1];
            local_208.z = (pOVar16->super_ON_SubDComponentBase).m_saved_subd_point1[2];
            bVar8 = ON_SubDComponentBase::SavedSubdivisionPointIsSet
                              (&pOVar15->super_ON_SubDComponentBase);
            if (!bVar8) {
              ON_SubDComponentBase::SetSavedSubdivisionPoint
                        (&pOVar15->super_ON_SubDComponentBase,&local_208.x);
            }
            pOVar17 = ON_SubDFace::MeshFragments(pOVar15);
            if (((pOVar17 == (ON_SubDMeshFragment *)0x0) &&
                (pOVar17 = ON_SubDFace::MeshFragments(pOVar16),
                pOVar17 != (ON_SubDMeshFragment *)0x0)) &&
               (pOVar17 = ON_SubDHeap::CopyMeshFragments
                                    (this_heap,pOVar16,destination_subd_display_density,pOVar15),
               pOVar17 != (ON_SubDMeshFragment *)0x0)) {
              *(byte *)copy_status = (byte)*copy_status | 1;
              uVar9 = ON_SubDMeshFragment::TextureCoordinateCount(pOVar17);
              if (uVar9 != 0) {
                *(byte *)copy_status = (byte)*copy_status | 2;
              }
              uVar9 = ON_SubDMeshFragment::CurvatureCount(pOVar17);
              if (uVar9 != 0) {
                *(byte *)copy_status = (byte)*copy_status | 4;
              }
              uVar9 = ON_SubDMeshFragment::ColorCount(pOVar17);
              if (uVar9 != 0) {
                *(byte *)copy_status = (byte)*copy_status | 8;
              }
            }
          }
          pOVar15 = ON_SubDFaceIdIterator::NextFaceOnLevel(&this_fit,level_index);
          pOVar16 = ON_SubDFaceIdIterator::NextFaceOnLevel(&src_fit,level_index_00);
        }
      }
      bVar8 = true;
    }
    else {
LAB_005e72e0:
      ON_SubDIncrementErrorCount();
LAB_005e72e5:
      bVar8 = false;
    }
    ON_SubDRef::~ON_SubDRef(&src_fit.m_subd_ref);
    ON_SubDRef::~ON_SubDRef(&this_fit.m_subd_ref);
  }
  else {
LAB_005e70f9:
    ON_SubDIncrementErrorCount();
LAB_005e70cc:
    bVar8 = false;
  }
  ON_SubDRef::~ON_SubDRef(&src_eit.m_subd_ref);
  ON_SubDRef::~ON_SubDRef(&this_eit.m_subd_ref);
LAB_005e6eb0:
  ON_SubDRef::~ON_SubDRef(&src_vit.m_subd_ref);
  ON_SubDRef::~ON_SubDRef(&this_vit.m_subd_ref);
  return bVar8;
}

Assistant:

bool ON_SubDLevel::CopyEvaluationCacheForExperts( ON_SubDHeap& this_heap, const ON_SubDLevel& src, const ON_SubDHeap& src_heap, unsigned& copy_status)
{
  copy_status = 0u;
  // Validate conditions for coping the cached evaluation information
  if (
    this == &src
    || m_vertex_count != src.m_vertex_count
    || m_edge_count != src.m_edge_count
    || m_face_count != src.m_face_count
    )
    return ON_SUBD_RETURN_ERROR(false);

  // The built in fragment cache always has adaptive ON_SubDDisplayParameters::DefaultDensity
  unsigned subd_display_density = ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(ON_SubDDisplayParameters::DefaultDensity,m_face_count);
  const unsigned this_level_index = this->m_level_index;
  const unsigned src_level_index = src.m_level_index;

  // It is critical to use the this_vit/src_vit iterators so we got through the vertices in id order.
  // When a copy of an edited subd is made, it is frequently the case that the vertex linked lists
  // are in different order. 
  ON_SubDVertexIdIterator this_vit;
  ON_SubDVertexIdIterator src_vit;
  this_heap.InitializeVertexIdIterator(this_vit);
  src_heap.InitializeVertexIdIterator(src_vit);

  ON_SubDVertex* this_vertex;
  const ON_SubDVertex* src_vertex;
  ON_SubDEdgePtr this_veptr, src_veptr;
  ON_SubDFace* this_face;
  const ON_SubDFace* src_face;
  bool bCopyVertexCache = false;
  for (
    this_vertex = const_cast<ON_SubDVertex*>(this_vit.FirstVertexOnLevel(this_level_index)), src_vertex = src_vit.FirstVertexOnLevel(src_level_index);
    nullptr != this_vertex && nullptr != src_vertex; 
    this_vertex = const_cast<ON_SubDVertex*>(this_vit.NextVertexOnLevel(this_level_index)), src_vertex = src_vit.NextVertexOnLevel(src_level_index)
    )
  {
    if (this_vertex->m_id != src_vertex->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_edge_count != src_vertex->m_edge_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_face_count != src_vertex->m_face_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->m_vertex_tag != src_vertex->m_vertex_tag)
      return ON_SUBD_RETURN_ERROR(false);
    if (false == (this_vertex->ControlNetPoint() == src_vertex->ControlNetPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->SavedSubdivisionPointIsSet() && false == (this_vertex->SubdivisionPoint() == src_vertex->SubdivisionPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_vertex->SavedSubdivisionPointIsSet() && this_vertex->SurfacePointIsSet())
      continue;
    if (false == src_vertex->SavedSubdivisionPointIsSet())
      continue;
    bCopyVertexCache = true;
    for (unsigned short vei = 0; vei < this_vertex->m_edge_count; ++vei)
    {
      this_veptr = this_vertex->m_edges[vei];
      src_veptr = src_vertex->m_edges[vei];
      if ( this_veptr.EdgeId() != src_veptr.EdgeId())
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_SUBD_EDGE_DIRECTION(this_veptr.m_ptr) != ON_SUBD_EDGE_DIRECTION(src_veptr.m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
    for (unsigned short vfi = 0; vfi < this_vertex->m_face_count; ++vfi)
    {
      this_face = const_cast<ON_SubDFace*>(this_vertex->m_faces[vfi]);
      src_face = src_vertex->m_faces[vfi];
      if (nullptr == this_face || nullptr == src_face || this_face->m_id != src_face->m_id)
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_vertex || nullptr != src_vertex)
    return ON_SUBD_RETURN_ERROR(false);

  // It is critical to use the this_eit/src_eit iterators so we got through the edges in id order.
  // When a copy of an edited subd is made, it is frequently the case that the edge linked lists
  // are in different order. 
  ON_SubDEdgeIdIterator this_eit;
  ON_SubDEdgeIdIterator src_eit;
  this_heap.InitializeEdgeIdIterator(this_eit);
  src_heap.InitializeEdgeIdIterator(src_eit);

  ON_SubDEdge* this_edge;
  const ON_SubDEdge* src_edge;
  const ON_SubDFacePtr* this_fptr;
  const ON_SubDFacePtr* src_fptr;
  bool bCopyEdgeCache = false;
  for (
    this_edge = const_cast<ON_SubDEdge*>(this_eit.FirstEdgeOnLevel(this_level_index)), src_edge = src_eit.FirstEdgeOnLevel(src_level_index);
    nullptr != this_edge && nullptr != src_edge;
    this_edge = const_cast<ON_SubDEdge*>(this_eit.NextEdgeOnLevel(this_level_index)), src_edge = src_eit.NextEdgeOnLevel(src_level_index)
    )
  {
    if (this_edge->m_id != src_edge->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->m_face_count != src_edge->m_face_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->m_edge_tag != src_edge->m_edge_tag)
      return ON_SUBD_RETURN_ERROR(false);
    for (int evi = 0; evi < 2; ++evi)
    {
      if (nullptr == this_edge->m_vertex[evi] || nullptr == src_edge->m_vertex[evi])
        return ON_SUBD_RETURN_ERROR(false);
      if (this_edge->m_vertex[evi]->m_id != src_edge->m_vertex[evi]->m_id)
        return ON_SUBD_RETURN_ERROR(false);
    }
    if (this_edge->SavedSubdivisionPointIsSet() && false == (this_edge->SubdivisionPoint() == src_edge->SubdivisionPoint()))
      return ON_SUBD_RETURN_ERROR(false);
    if (this_edge->SavedSubdivisionPointIsSet() && this_edge->EdgeSurfaceCurveIsSet())
      continue;
    if (false == src_edge->SavedSubdivisionPointIsSet())
      continue;
    bCopyEdgeCache = true;
    this_fptr = this_edge->m_face2;
    src_fptr = src_edge->m_face2;
    for (unsigned short efi = 0; efi < this_edge->m_face_count; ++efi, ++this_fptr, ++src_fptr)
    {
      if (2 == efi)
      {
        this_fptr = this_edge->m_facex;
        src_fptr = src_edge->m_facex;
        if (nullptr == this_fptr || nullptr == src_fptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      this_face = ON_SUBD_FACE_POINTER(this_fptr->m_ptr);
      src_face = ON_SUBD_FACE_POINTER(src_fptr->m_ptr);
      if (nullptr == this_face || nullptr == src_face || this_face->m_id != src_face->m_id )
        return ON_SUBD_RETURN_ERROR(false);
      if ( this_face->m_edge_count != src_face->m_edge_count )
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_SUBD_FACE_DIRECTION(this_fptr->m_ptr) != ON_SUBD_FACE_DIRECTION(src_fptr->m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_edge || nullptr != src_edge)
    return ON_SUBD_RETURN_ERROR(false);

  // It is critical to use the this_fit/src_fit iterators so we got through the faces in id order.
  // When a copy of an edited subd is made, it is frequently the case that the face linked lists
  // are in different order. 
  ON_SubDFaceIdIterator this_fit;
  ON_SubDFaceIdIterator src_fit;
  this_heap.InitializeFaceIdIterator(this_fit);
  src_heap.InitializeFaceIdIterator(src_fit);

  const ON_SubDEdgePtr* this_eptr;
  const ON_SubDEdgePtr* src_eptr;
  bool bCopyFaceCache = false;
  for (
    this_face = const_cast<ON_SubDFace*>(this_fit.FirstFaceOnLevel(this_level_index)), src_face = src_fit.FirstFaceOnLevel(src_level_index);
    nullptr != this_face && nullptr != src_face;
    this_face = const_cast<ON_SubDFace*>(this_fit.NextFaceOnLevel(this_level_index)), src_face = src_fit.NextFaceOnLevel(src_level_index)
    )
  {
    if (this_face->m_id != src_face->m_id)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->m_edge_count != src_face->m_edge_count)
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->SavedSubdivisionPointIsSet() && false == (this_face->SubdivisionPoint() == src_face->SubdivisionPoint()) )
      return ON_SUBD_RETURN_ERROR(false);
    if (this_face->SavedSubdivisionPointIsSet() && nullptr != this_face->MeshFragments())
      continue;
    if (false == src_face->SavedSubdivisionPointIsSet())
      continue;
    bCopyFaceCache = true;
    this_eptr = this_face->m_edge4;
    src_eptr = src_face->m_edge4;
    for (unsigned short fei = 0; fei < this_face->m_edge_count; ++fei, ++this_eptr, ++src_eptr)
    {
      if (4 == fei)
      {
        this_eptr = this_face->m_edgex;
        src_eptr = src_face->m_edgex;
        if(nullptr == this_eptr || nullptr == src_eptr)
          return ON_SUBD_RETURN_ERROR(false);
      }
      if ( this_eptr->EdgeId() != src_eptr->EdgeId())
        return ON_SUBD_RETURN_ERROR(false);
      if ( ON_SUBD_EDGE_DIRECTION(this_eptr->m_ptr) != ON_SUBD_EDGE_DIRECTION(src_eptr->m_ptr))
        return ON_SUBD_RETURN_ERROR(false);
    }
  }
  if (nullptr != this_face || nullptr != src_face)
    return ON_SUBD_RETURN_ERROR(false);

  if (false == bCopyVertexCache && false == bCopyEdgeCache && false == bCopyFaceCache)
    return false;

  // this and src subd have identical geometry - copy evaluation cache

  double subdivision_point[3];
  if (bCopyVertexCache)
  {
    // It is critical to use the this_vit/src_vit iterators so we got through the vertices in id order.
    // When a copy of an edited subd is made, it is frequently the case that the vertex linked lists
    // are in different order. 
    ON_SubDSectorSurfacePoint this_limit_point;
    for (
      this_vertex = const_cast<ON_SubDVertex*>(this_vit.FirstVertexOnLevel(this_level_index)), src_vertex = src_vit.FirstVertexOnLevel(src_level_index);
      nullptr != this_vertex && nullptr != src_vertex;
      this_vertex = const_cast<ON_SubDVertex*>(this_vit.NextVertexOnLevel(this_level_index)), src_vertex = src_vit.NextVertexOnLevel(src_level_index)
      )
    {
      if (false == src_vertex->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if (false == this_vertex->SavedSubdivisionPointIsSet())
        this_vertex->SetSavedSubdivisionPoint(subdivision_point);
     
      if (false == this_vertex->SurfacePointIsSet())
      {
        for (const ON_SubDSectorSurfacePoint* src_limit_point = &src_vertex->SectorSurfacePointForExperts(); nullptr != src_limit_point; src_limit_point = src_limit_point->m_next_sector_limit_point)
        {
          this_limit_point = *src_limit_point;
          this_limit_point.m_next_sector_limit_point = (ON_SubDSectorSurfacePoint*)1;
          this_limit_point.m_sector_face = nullptr;
          if (nullptr != src_limit_point->m_sector_face)
          {
            const unsigned vfi = src_vertex->FaceArrayIndex(src_limit_point->m_sector_face);
            if (vfi >= src_vertex->m_face_count)
              break;
            this_limit_point.m_sector_face = this_vertex->m_faces[vfi];
          }
          this_vertex->SetSavedSurfacePoint(true, this_limit_point);
        }
      }
    }
  }

  if (bCopyEdgeCache)
  {    
    // It is critical to use the this_eit/src_eit iterators so we got through the edges in id order.
    // When a copy of an edited subd is made, it is frequently the case that the edge linked lists
    // are in different order. 
    ON_SimpleArray<ON_3dPoint> edge_curve_cvs(ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity);
    for (
      this_edge = const_cast<ON_SubDEdge*>(this_eit.FirstEdgeOnLevel(this_level_index)), src_edge = src_eit.FirstEdgeOnLevel(src_level_index);
      nullptr != this_edge && nullptr != src_edge;
      this_edge = const_cast<ON_SubDEdge*>(this_eit.NextEdgeOnLevel(this_level_index)), src_edge = src_eit.NextEdgeOnLevel(src_level_index)
      )
    {
      if (false == src_edge->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if (false == this_edge->SavedSubdivisionPointIsSet())
        this_edge->SetSavedSubdivisionPoint(subdivision_point);
      if ( false == this_edge->EdgeSurfaceCurveIsSet() && src_edge->EdgeSurfaceCurveIsSet( ))
        this_heap.CopyEdgeSurfaceCurve(src_edge, this_edge);
    }
  }

  if (bCopyFaceCache)
  {
    // It is critical to use the this_fit/src_fit iterators so we got through the faces in id order.
    // When a copy of an edited subd is made, it is frequently the case that the face linked lists
    // are in different order. 
    for (
      this_face = const_cast<ON_SubDFace*>(this_fit.FirstFaceOnLevel(this_level_index)), src_face = src_fit.FirstFaceOnLevel(src_level_index);
      nullptr != this_face && nullptr != src_face;
      this_face = const_cast<ON_SubDFace*>(this_fit.NextFaceOnLevel(this_level_index)), src_face = src_fit.NextFaceOnLevel(src_level_index)
      )
    {
      if (false == src_face->GetSavedSubdivisionPoint(subdivision_point))
        continue;
      if ( false == this_face->SavedSubdivisionPointIsSet())
        this_face->SetSavedSubdivisionPoint(subdivision_point);
      if (nullptr == this_face->MeshFragments() && nullptr != src_face->MeshFragments())
      {
        const ON_SubDMeshFragment* this_frag = this_heap.CopyMeshFragments(src_face, subd_display_density, this_face);
        if (nullptr != this_frag)
        {
          copy_status |= 1u;
          if (this_frag->TextureCoordinateCount() > 0)
            copy_status |= 2u;
          if (this_frag->CurvatureCount() > 0)
            copy_status |= 4u;
          if (this_frag->ColorCount() > 0)
            copy_status |= 8u;
        }
      }
    }
  }

  return true;
}